

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O1

void __thiscall HighsConflictPool::removeConflict(HighsConflictPool *this,HighsInt conflict)

{
  int *piVar1;
  pointer puVar2;
  int iVar3;
  pointer ppCVar4;
  pointer psVar5;
  pointer ppVar6;
  iterator __position;
  long lVar7;
  pointer ppCVar8;
  HighsInt start;
  HighsInt local_2c;
  int local_28;
  int local_24;
  
  ppCVar4 = (this->propagationDomains).
            super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_2c = conflict;
  for (ppCVar8 = (this->propagationDomains).
                 super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar8 != ppCVar4;
      ppCVar8 = ppCVar8 + 1) {
    HighsDomain::ConflictPoolPropagation::conflictDeleted(*ppCVar8,local_2c);
  }
  psVar5 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)psVar5[local_2c];
  if (-1 < lVar7) {
    piVar1 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar7;
    *piVar1 = *piVar1 + -1;
    psVar5[local_2c] = -1;
  }
  ppVar6 = (this->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_28 = ppVar6[local_2c].first;
  iVar3 = ppVar6[local_2c].second;
  __position._M_current =
       (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->deletedConflicts_,__position,&local_2c);
  }
  else {
    *__position._M_current = local_2c;
    (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_24 = iVar3 - local_28;
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_emplace_unique<int,int&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&this->freeSpaces_,&local_24,&local_28);
  ppVar6 = (this->conflictRanges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar6[local_2c].first = -1;
  ppVar6[local_2c].second = -1;
  puVar2 = (this->modification_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + local_2c;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void HighsConflictPool::removeConflict(HighsInt conflict) {
  for (HighsDomain::ConflictPoolPropagation* conflictProp : propagationDomains)
    conflictProp->conflictDeleted(conflict);

  if (ages_[conflict] >= 0) {
    ageDistribution_[ages_[conflict]] -= 1;
    ages_[conflict] = -1;
  }

  HighsInt start = conflictRanges_[conflict].first;
  HighsInt end = conflictRanges_[conflict].second;

  // register the space of the deleted row and the index so that it can be
  // reused
  deletedConflicts_.push_back(conflict);
  freeSpaces_.emplace(end - start, start);

  // set the range to -1,-1 to indicate a deleted row
  conflictRanges_[conflict].first = -1;
  conflictRanges_[conflict].second = -1;
  ++modification_[conflict];
}